

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

void __thiscall
MarkerIndex::Iterator::seek_to_first_node_greater_than_or_equal_to(Iterator *this,Point *position)

{
  bool bVar1;
  Point *position_local;
  Iterator *this_local;
  
  while( true ) {
    cache_node_position(this);
    bVar1 = Point::operator==(position,&this->current_node_position);
    if (bVar1) break;
    bVar1 = Point::operator<(position,&this->current_node_position);
    if (bVar1) {
      if (this->current_node->left == (Node *)0x0) break;
      descend_left(this);
    }
    else {
      if (this->current_node->right == (Node *)0x0) break;
      descend_right(this);
    }
  }
  bVar1 = Point::operator<(&this->current_node_position,position);
  if (bVar1) {
    move_to_successor(this);
  }
  return;
}

Assistant:

void MarkerIndex::Iterator::seek_to_first_node_greater_than_or_equal_to(const Point &position) {
  while (true) {
    cache_node_position();
    if (position == current_node_position) {
      break;
    } else if (position < current_node_position) {
      if (current_node->left) {
        descend_left();
      } else {
        break;
      }
    } else { // position > current_node_position
      if (current_node->right) {
        descend_right();
      } else {
        break;
      }
    }
  }

  if (current_node_position < position) move_to_successor();
}